

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifold_test.cpp
# Opt level: O1

Polygons * RotatePolygons(Polygons *__return_storage_ptr__,Polygons *polys,int index)

{
  pointer pvVar1;
  pointer __x;
  vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_> rotatedPolygon;
  vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_> local_40;
  
  (__return_storage_ptr__->
  super__Vector_base<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __x = (polys->
        super__Vector_base<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (polys->
           super__Vector_base<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (__x != pvVar1) {
    do {
      std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>::vector
                (&local_40,__x);
      std::_V2::
      __rotate<__gnu_cxx::__normal_iterator<linalg::vec<double,2>*,std::vector<linalg::vec<double,2>,std::allocator<linalg::vec<double,2>>>>>
                (local_40.
                 super__Vector_base<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_40.
                 super__Vector_base<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + index,
                 local_40.
                 super__Vector_base<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      std::
      vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
      ::push_back(__return_storage_ptr__,&local_40);
      if (local_40.
          super__Vector_base<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_40.
                        super__Vector_base<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_40.
                              super__Vector_base<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_40.
                              super__Vector_base<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      __x = __x + 1;
    } while (__x != pvVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

Polygons RotatePolygons(Polygons polys, const int index) {
  Polygons rotatedPolys;
  for (auto& polygon : polys) {
    auto rotatedPolygon = polygon;
    std::rotate(rotatedPolygon.begin(), rotatedPolygon.begin() + index,
                rotatedPolygon.end());
    rotatedPolys.push_back(rotatedPolygon);
  }
  return rotatedPolys;
}